

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int derive_exporter_secret(ptls_t *tls,int is_early)

{
  void *pvVar1;
  int in_ESI;
  long *in_RDI;
  char *unaff_retaddr;
  void *in_stack_00000008;
  ptls_key_schedule_t *in_stack_00000010;
  uint8_t **slot;
  int ret;
  char *in_stack_00000058;
  ptls_t *in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  long *local_38;
  int local_4;
  
  if ((*(byte *)(*in_RDI + 0x70) >> 1 & 1) == 0) {
    local_4 = 0;
  }
  else {
    if (in_ESI == 0) {
      local_38 = in_RDI + 0x2b;
    }
    else {
      local_38 = in_RDI + 0x2a;
    }
    if (*local_38 != 0) {
      __assert_fail("*slot == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x412,"int derive_exporter_secret(ptls_t *, int)");
    }
    pvVar1 = malloc(*(size_t *)(*(long *)(in_RDI[10] + 0x58) + 8));
    *local_38 = (long)pvVar1;
    if (pvVar1 == (void *)0x0) {
      local_4 = 0x201;
    }
    else {
      local_4 = derive_secret(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      if (local_4 == 0) {
        ptls_iovec_init((void *)*local_38,*(size_t *)(*(long *)(in_RDI[10] + 0x58) + 8));
        log_secret(in_stack_00000060,in_stack_00000058,(ptls_iovec_t)in_stack_00000068);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int derive_exporter_secret(ptls_t *tls, int is_early)
{
    int ret;

    if (!tls->ctx->use_exporter)
        return 0;

    uint8_t **slot = is_early ? &tls->exporter_master_secret.early : &tls->exporter_master_secret.one_rtt;
    assert(*slot == NULL);
    if ((*slot = malloc(tls->key_schedule->hashes[0].algo->digest_size)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    if ((ret = derive_secret(tls->key_schedule, *slot, is_early ? "e exp master" : "exp master")) != 0)
        return ret;

    log_secret(tls, is_early ? "EARLY_EXPORTER_SECRET" : "EXPORTER_SECRET",
               ptls_iovec_init(*slot, tls->key_schedule->hashes[0].algo->digest_size));

    return 0;
}